

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schedule.hpp
# Opt level: O0

Schedule * __thiscall Schedule::info_abi_cxx11_(Schedule *this)

{
  ostream *poVar1;
  Schedule *in_RSI;
  string local_200 [32];
  string local_1e0 [48];
  stringstream local_1b0 [8];
  stringstream ss;
  ostream local_1a0 [376];
  pair<unsigned_long,_unsigned_long> local_28;
  Schedule *this_local;
  
  this_local = this;
  local_28 = analyze(in_RSI);
  std::__cxx11::stringstream::stringstream(local_1b0);
  poVar1 = std::operator<<(local_1a0,"peak memory: ");
  prettyBytes_abi_cxx11_((size_t)local_1e0);
  poVar1 = std::operator<<(poVar1,local_1e0);
  std::operator<<(poVar1,", ");
  std::__cxx11::string::~string(local_1e0);
  poVar1 = std::operator<<(local_1a0,"total time: ");
  prettyNanoseconds_abi_cxx11_((uint64_t)local_200);
  std::operator<<(poVar1,local_200);
  std::__cxx11::string::~string(local_200);
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1b0);
  return this;
}

Assistant:

std::string info() {
        analyze();
        std::stringstream ss;
        ss << "peak memory: " << prettyBytes(peak_memory) << ", ";
        ss << "total time: " << prettyNanoseconds(total_time);
        return ss.str();
    }